

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_classes.cc
# Opt level: O3

bool __thiscall
TolerancePicker::operator()
          (TolerancePicker *this,
          sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_> *sample
          ,cvector *actual)

{
  ostream *poVar1;
  double dVar2;
  
  dVar2 = PhaseSubtractor::phase_difference((PhaseSubtractor *)this,sample,actual);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Output=",7);
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           (complex *)
                           (actual->
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," PhaseError=",0xc);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return 0.05 < dVar2;
}

Assistant:

bool operator()(const learning::sample<cvector> &sample, const cvector &actual) const {
		double err = phase_difference(sample, actual);

		cerr << "Output=" << actual[0] << " PhaseError=" << err << endl;

		return err > TOLERANCE;
	}